

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPat.c
# Opt level: O1

void Gia_SatVerifyPattern(Gia_Man_t *p,Gia_Obj_t *pRoot,Vec_Int_t *vCex,Vec_Int_t *vVisit)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  if ((-1 < (int)(uint)*(undefined8 *)pRoot) ||
     (uVar4 = (uint)*(undefined8 *)pRoot & 0x1fffffff, uVar4 == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsCo(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPat.c"
                  ,0x61,
                  "void Gia_SatVerifyPattern(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if ((~*(ulong *)(pRoot + -(ulong)uVar4) & 0x1fffffff1fffffff) == 0) {
    __assert_fail("!Gia_ObjIsConst0(Gia_ObjFanin0(pRoot))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPat.c"
                  ,0x62,
                  "void Gia_SatVerifyPattern(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  Gia_SatCollectCone(p,pRoot + -(ulong)uVar4,vVisit);
  if (0 < vCex->nSize) {
    lVar5 = 0;
    do {
      uVar4 = vCex->pArray[lVar5];
      if ((int)uVar4 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10c,"int Abc_Lit2Var(int)");
      }
      if (p->vCis->nSize <= (int)(uVar4 >> 1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = p->vCis->pArray[uVar4 >> 1];
      lVar6 = (long)iVar2;
      if ((lVar6 < 0) || (p->nObjs <= iVar2)) goto LAB_00701aa8;
      uVar4 = 2 - (uVar4 & 1);
      *(ulong *)(p->pObjs + lVar6) =
           (ulong)(uVar4 >> 1) << 0x3e | (ulong)((uVar4 & 1) << 0x1e) |
           *(ulong *)(p->pObjs + lVar6) & 0xbfffffffbfffffff;
      lVar5 = lVar5 + 1;
    } while (lVar5 < vCex->nSize);
  }
  if (0 < vVisit->nSize) {
    lVar5 = 0;
    do {
      iVar2 = vVisit->pArray[lVar5];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00701aa8;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar2;
      uVar3 = *(ulong *)pGVar1;
      uVar4 = (uint)uVar3;
      if ((~uVar4 & 0x9fffffff) != 0) {
        if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPat.c"
                        ,0x6e,
                        "void Gia_SatVerifyPattern(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        uVar7 = (uint)(*(ulong *)(pGVar1 + -(ulong)(uVar4 & 0x1fffffff)) >> 0x1e) & 1 |
                (uint)(*(ulong *)(pGVar1 + -(ulong)(uVar4 & 0x1fffffff)) >> 0x3d) & 2;
        uVar9 = (uint)(*(ulong *)(pGVar1 + -(ulong)((uint)(uVar3 >> 0x20) & 0x1fffffff)) >> 0x1e) &
                1 | (uint)(*(ulong *)(pGVar1 + -(ulong)((uint)(uVar3 >> 0x20) & 0x1fffffff)) >> 0x3d
                          ) & 2;
        uVar8 = 1;
        if (((uVar3 >> 0x3d & 1) != 0) + 1 != uVar9) {
          uVar8 = (uVar7 == 3 || uVar9 == 3) | 2;
        }
        if (((uVar4 >> 0x1d & 1) != 0) + 1 == uVar7) {
          uVar8 = 1;
        }
        *(ulong *)pGVar1 =
             (ulong)(uVar8 >> 1) << 0x3e | uVar3 & 0xbfffffff3fffffff | (ulong)((uVar8 & 1) << 0x1e)
        ;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < vVisit->nSize);
  }
  uVar4 = (uint)(*(ulong *)(pRoot + -(ulong)((uint)*(undefined8 *)pRoot & 0x1fffffff)) >> 0x1e) & 1
          | (uint)(*(ulong *)(pRoot + -(ulong)((uint)*(undefined8 *)pRoot & 0x1fffffff)) >> 0x3d) &
            2;
  if ((uVar4 == 3) || ((((uint)*(undefined8 *)pRoot >> 0x1d & 1) != 0) + 1 == uVar4)) {
    puts("Gia_SatVerifyPattern(): Verification FAILED.");
  }
  if (0 < vVisit->nSize) {
    lVar5 = 0;
    do {
      iVar2 = vVisit->pArray[lVar5];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_00701aa8:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar1 = p->pObjs + iVar2;
      *(ulong *)pGVar1 = *(ulong *)pGVar1 & 0xbfffffffbfffffff;
      lVar5 = lVar5 + 1;
    } while (lVar5 < vVisit->nSize);
  }
  return;
}

Assistant:

void Gia_SatVerifyPattern( Gia_Man_t * p, Gia_Obj_t * pRoot, Vec_Int_t * vCex, Vec_Int_t * vVisit )
{
    Gia_Obj_t * pObj;
    int i, Entry, Value, Value0, Value1;
    assert( Gia_ObjIsCo(pRoot) );
    assert( !Gia_ObjIsConst0(Gia_ObjFanin0(pRoot)) );
    // collect nodes and initialized them to x
    Gia_SatCollectCone( p, Gia_ObjFanin0(pRoot), vVisit );
    // set binary values to nodes in the counter-example
    Vec_IntForEachEntry( vCex, Entry, i )
//        Sat_ObjSetXValue( Gia_ManObj(p, Abc_Lit2Var(Entry)), Abc_LitIsCompl(Entry)? GIA_ZER : GIA_ONE );
        Sat_ObjSetXValue( Gia_ManCi(p, Abc_Lit2Var(Entry)), Abc_LitIsCompl(Entry)? GIA_ZER : GIA_ONE );
    // simulate
    Gia_ManForEachObjVec( vVisit, p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            continue;
        assert( Gia_ObjIsAnd(pObj) );
        Value0 = Sat_ObjXValue( Gia_ObjFanin0(pObj) );
        Value1 = Sat_ObjXValue( Gia_ObjFanin1(pObj) );
        Value = Gia_XsimAndCond( Value0, Gia_ObjFaninC0(pObj), Value1, Gia_ObjFaninC1(pObj) );
        Sat_ObjSetXValue( pObj, Value );
    }
    Value = Sat_ObjXValue( Gia_ObjFanin0(pRoot) );
    Value = Gia_XsimNotCond( Value, Gia_ObjFaninC0(pRoot) );
    if ( Value != GIA_ONE )
        printf( "Gia_SatVerifyPattern(): Verification FAILED.\n" );
//    else
//        printf( "Gia_SatVerifyPattern(): Verification succeeded.\n" );
//    assert( Value == GIA_ONE );
    // clean the nodes
    Gia_ManForEachObjVec( vVisit, p, pObj, i )
        Sat_ObjSetXValue( pObj, 0 );
}